

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCodeLoadIndexColumn(Parse *pParse,Index *pIdx,int iTabCur,int iIdxCol,int regOut)

{
  i16 iTabCol;
  int regOut_local;
  int iIdxCol_local;
  int iTabCur_local;
  Index *pIdx_local;
  Parse *pParse_local;
  
  if (pIdx->aiColumn[iIdxCol] == -2) {
    pParse->iSelfTab = iTabCur + 1;
    sqlite3ExprCodeCopy(pParse,pIdx->aColExpr->a[iIdxCol].pExpr,regOut);
    pParse->iSelfTab = 0;
  }
  else {
    sqlite3ExprCodeGetColumnOfTable
              (pParse->pVdbe,pIdx->pTable,iTabCur,(int)pIdx->aiColumn[iIdxCol],regOut);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeLoadIndexColumn(
  Parse *pParse,  /* The parsing context */
  Index *pIdx,    /* The index whose column is to be loaded */
  int iTabCur,    /* Cursor pointing to a table row */
  int iIdxCol,    /* The column of the index to be loaded */
  int regOut      /* Store the index column value in this register */
){
  i16 iTabCol = pIdx->aiColumn[iIdxCol];
  if( iTabCol==XN_EXPR ){
    assert( pIdx->aColExpr );
    assert( pIdx->aColExpr->nExpr>iIdxCol );
    pParse->iSelfTab = iTabCur + 1;
    sqlite3ExprCodeCopy(pParse, pIdx->aColExpr->a[iIdxCol].pExpr, regOut);
    pParse->iSelfTab = 0;
  }else{
    sqlite3ExprCodeGetColumnOfTable(pParse->pVdbe, pIdx->pTable, iTabCur,
                                    iTabCol, regOut);
  }
}